

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::
MessageVisitor<should_visit_empty_repeating_group::Visitor,DefaultTestRules<Fixpp::v44::Spec::Dictionary>>
::operator()(MessageVisitor<should_visit_empty_repeating_group::Visitor,DefaultTestRules<Fixpp::v44::Spec::Dictionary>>
             *this)

{
  StreamCursor *this_00;
  StreamBuf<char> *pSVar1;
  StreamCursor *pSVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  long lVar6;
  ulong uVar7;
  Type type;
  size_t sVar8;
  byte *pbVar9;
  char *pcVar10;
  void **ppvVar11;
  ParsingContext *pPVar12;
  _Base_bitset<1UL> _Var13;
  bool bVar14;
  undefined1 local_490 [8];
  VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  header;
  VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  message;
  FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>_>
  messageVisitor_1;
  FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>_>
  messageVisitor;
  
  _Var13._M_w = (long)&header.
                       super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                       .
                       super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                       .unparsed.
                       super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
                       .
                       super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_void>
                + 0x10;
  memset(local_490,0,400);
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX =
       (void *)((long)(header.
                       super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                       .
                       super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                       .unparsed.Storage.InlineElts + 8) + 0x10);
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .allBits.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)
       ((long)&message.
               super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
               .
               super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
               .unparsed.
               super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
               .
               super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_false>
               .
               super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_void>
       + 0x10);
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<6UL,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>.
  value.m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .requiredBits.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_false>.
  value.m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<6UL,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_false>.
  value.m_view.first = (char *)0x0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<925U,_Fixpp::Type::Int>_>,_false>.
  value.m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_false>.
  value.m_view.first = (char *)0x0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.
  super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<554U,_Fixpp::Type::String>_>,_false>.value.
  m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<925U,_Fixpp::Type::Int>_>,_false>.
  value.m_view.first = (char *)0x0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.
  super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_false>.value.
  m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.
  super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<554U,_Fixpp::Type::String>_>,_false>.value.
  m_view.first = (char *)0x0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_false>.
  value.m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.
  super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_false>.value.
  m_view.first = (char *)0x0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.
  super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_false>.value.
  m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_false>.
  value.m_view.first = (char *)0x0;
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x10] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x11] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x12] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x13] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x14] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x15] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x16] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x17] = '\0';
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .values.base.
  super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_false>.value.
  m_view.first = (char *)0x0;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX =
       (void *)((long)(message.
                       super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
                       .
                       super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
                       .unparsed.Storage.InlineElts + 8) + 0x10);
  this_00 = (StreamCursor *)**(undefined8 **)this;
  bVar3 = false;
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .allBits.super__Base_bitset<1UL>._M_w = _Var13;
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_void>
  .super_SmallVectorBase.BeginX = (void *)_Var13;
  message.
  super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_void>
  .super_SmallVectorBase.BeginX =
       (void *)message.
               super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
               .
               super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
               .allBits.super__Base_bitset<1UL>._M_w;
  do {
    pSVar1 = this_00->buf;
    if (((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
        (lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar6 == 0)) ||
       (*(char *)(*(long *)this + 0x38) != '\x01')) goto LAB_009e0a4f;
    pSVar1 = this_00->buf;
    if ((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
       (lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar6 == 0)) {
      bVar14 = false;
    }
    else {
      pSVar1 = this_00->buf;
      pbVar9 = *(byte **)&pSVar1->field_0x10;
      lVar6 = *(long *)&pSVar1->field_0x18 - (long)pbVar9;
      if (lVar6 == 0) {
        lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))();
      }
      sVar8 = 0;
      ppvVar11 = (void **)0x0;
      do {
        if ((byte)(*pbVar9 - 0x30) < 10) {
          ppvVar11 = (void **)(ulong)(((uint)*pbVar9 + (int)ppvVar11 * 10) - 0x30);
          sVar8 = sVar8 + 1;
          lVar6 = lVar6 + -1;
          bVar14 = lVar6 != 0;
        }
        else {
          bVar14 = false;
        }
        pbVar9 = pbVar9 + 1;
      } while (bVar14);
      bVar14 = sVar8 != 0;
      if (bVar14) {
        bVar14 = true;
        StreamCursor::advance(this_00,sVar8);
        _Var13._M_w = (_WordT)ppvVar11;
      }
    }
    if (bVar14) {
      bVar14 = StreamCursor::advance(this_00,1);
      if (!bVar14) {
        pPVar12 = *(ParsingContext **)this;
        type = Incomplete;
        pcVar10 = "Expected value after Tag %d, got EOF";
        uVar7 = _Var13._M_w & 0xffffffff;
        goto LAB_009e07b8;
      }
      if (bVar3 == false) {
        messageVisitor_1._8_8_ = *(undefined8 *)this;
        bVar3 = doVisitField<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type:___l,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul>
                          (local_490,_Var13._M_w & 0xffffffff,&messageVisitor_1.strict);
        if (bVar3) {
          cVar4 = '\x02';
          bVar3 = false;
        }
        else {
          message.
          super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
          .
          super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
          .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer._16_8_ =
               *(undefined8 *)this;
          messageVisitor_1.context._0_2_ = 0;
          bVar3 = doVisitField<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<(char)66,(char)70>,Fixpp::Required<Fixpp::TagT<923u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<924u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<553u,Fixpp::Type::String>>,Fixpp::TagT<554u,Fixpp::Type::String>,Fixpp::TagT<925u,Fixpp::Type::Int>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<(char)66,(char)70>,Fixpp::Required<Fixpp::TagT<923u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<924u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<553u,Fixpp::Type::String>>,Fixpp::TagT<554u,Fixpp::Type::String>,Fixpp::TagT<925u,Fixpp::Type::Int>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul>
                            ((long)(header.
                                    super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                                    .
                                    super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                                    .unparsed.Storage.InlineElts + 8) + 0x10,
                             _Var13._M_w & 0xffffffff,
                             (long)(message.
                                    super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
                                    .
                                    super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
                                    .unparsed.Storage.InlineElts + 8) + 0x10);
          cVar4 = bVar3 * '\x02';
        }
        if (cVar4 == '\0') goto LAB_009e0848;
      }
      else {
        messageVisitor_1._8_8_ = *(undefined8 *)this;
        bVar14 = doVisitField<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<(char)66,(char)70>,Fixpp::Required<Fixpp::TagT<923u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<924u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<553u,Fixpp::Type::String>>,Fixpp::TagT<554u,Fixpp::Type::String>,Fixpp::TagT<925u,Fixpp::Type::Int>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<(char)66,(char)70>,Fixpp::Required<Fixpp::TagT<923u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<924u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<553u,Fixpp::Type::String>>,Fixpp::TagT<554u,Fixpp::Type::String>,Fixpp::TagT<925u,Fixpp::Type::Int>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul>
                           ((long)(header.
                                   super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                                   .
                                   super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                                   .unparsed.Storage.InlineElts + 8) + 0x10,_Var13._M_w & 0xffffffff
                            ,&messageVisitor_1.strict);
        bVar3 = true;
        if (bVar14) {
          cVar4 = bVar14 * '\x02';
        }
        else {
LAB_009e0848:
          pSVar2 = this_00;
          if ((int)_Var13._M_w == 10) {
            pSVar1 = this_00->buf;
            if ((*(long *)&pSVar1->field_0x18 != *(long *)&pSVar1->field_0x10) ||
               (lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar6 != 0)) {
              pSVar1 = this_00->buf;
              pcVar10 = *(char **)&pSVar1->field_0x10;
              lVar6 = *(long *)&pSVar1->field_0x18 - (long)pcVar10;
              if (lVar6 == 0) {
                lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))();
              }
              sVar8 = 0;
              do {
                sVar8 = sVar8 + ((byte)(*pcVar10 - 0x30U) < 10);
                lVar6 = lVar6 + -1;
                if (9 < (byte)(*pcVar10 - 0x30U)) break;
                pcVar10 = pcVar10 + 1;
              } while (lVar6 != 0);
              if (sVar8 != 0) {
                cVar4 = '\x03';
                StreamCursor::advance(this_00,sVar8);
                goto LAB_009e07c8;
              }
            }
            pPVar12 = *(ParsingContext **)this;
            pSVar1 = this_00->buf;
            if ((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
               (lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar6 == 0)) {
              cVar5 = '?';
            }
            else {
              pSVar1 = this_00->buf;
              if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
                cVar5 = **(char **)&pSVar1->field_0x10;
              }
              else {
                cVar5 = (**(code **)(*(long *)pSVar1 + 0x48))();
              }
            }
            cVar4 = '\x01';
            ParsingContext::setError
                      (pPVar12,ParsingError,"Invalid checksum, expected int, got \'%c\'",
                       (ulong)(uint)(int)cVar5);
          }
          else {
            while( true ) {
              messageVisitor_1._8_8_ = pSVar2;
              pSVar1 = this_00->buf;
              if (*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) {
                lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))();
                bVar14 = lVar6 == 0;
              }
              else {
                bVar14 = false;
              }
              if (bVar14) {
                ParsingContext::setError
                          (*(ParsingContext **)this,ParsingError,
                           "Expected value after tag %d, got EOF",_Var13._M_w & 0xffffffff);
                goto LAB_009e095a;
              }
              pSVar1 = this_00->buf;
              if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
                cVar4 = **(char **)&pSVar1->field_0x10;
              }
              else {
                cVar4 = (**(code **)(*(long *)pSVar1 + 0x48))();
              }
              if (cVar4 == '|') break;
              StreamCursor::advance(this_00,1);
              pSVar2 = (StreamCursor *)messageVisitor_1._8_8_;
            }
            if (bVar3 == false) {
              handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::TypedParsingContext<void>>
                        (this,&messageVisitor_1.strict,local_490,*(undefined8 *)this,
                         _Var13._M_w & 0xffffffff);
            }
            else {
              handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<(char)66,(char)70>,Fixpp::Required<Fixpp::TagT<923u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<924u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<553u,Fixpp::Type::String>>,Fixpp::TagT<554u,Fixpp::Type::String>,Fixpp::TagT<925u,Fixpp::Type::Int>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>>,Fixpp::TypedParsingContext<void>>
                        (this,&messageVisitor_1.strict,
                         (long)(header.
                                super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                                .
                                super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                                .unparsed.Storage.InlineElts + 8) + 0x10,*(undefined8 *)this,
                         _Var13._M_w & 0xffffffff);
            }
LAB_009e095a:
            cVar4 = '\x01';
            if (!bVar14) {
              bVar14 = StreamCursor::advance(this_00,1);
              if (bVar14) {
                cVar4 = '\0';
              }
              else {
                ParsingContext::setError(*(ParsingContext **)this,Incomplete,"Got early EOF");
              }
            }
          }
        }
      }
    }
    else {
      pPVar12 = *(ParsingContext **)this;
      pSVar1 = this_00->buf;
      if ((*(long *)&pSVar1->field_0x18 == *(long *)&pSVar1->field_0x10) &&
         (lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar6 == 0)) {
        cVar4 = '?';
      }
      else {
        pSVar1 = this_00->buf;
        if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
          cVar4 = **(char **)&pSVar1->field_0x10;
        }
        else {
          cVar4 = (**(code **)(*(long *)pSVar1 + 0x48))();
        }
      }
      uVar7 = (ulong)(uint)(int)cVar4;
      type = ParsingError;
      pcVar10 = "Encountered invalid tag, expected int, got \'%c\'";
LAB_009e07b8:
      cVar4 = '\x01';
      ParsingContext::setError(pPVar12,type,pcVar10,uVar7);
    }
LAB_009e07c8:
  } while ((cVar4 == '\0') || (cVar4 == '\x02'));
  if (cVar4 == '\x03') {
LAB_009e0a4f:
    if (*(char *)(*(long *)this + 0x38) == '\x01') {
      callVisitor<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<(char)66,(char)70>,Fixpp::Required<Fixpp::TagT<923u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<924u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<553u,Fixpp::Type::String>>,Fixpp::TagT<554u,Fixpp::Type::String>,Fixpp::TagT<925u,Fixpp::Type::Int>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>>>
                (this,local_490,
                 (long)(header.
                        super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                        .
                        super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                        .unparsed.Storage.InlineElts + 8) + 0x10);
    }
  }
  if (message.
      super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
      .
      super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
      .allBits.super__Base_bitset<1UL>._M_w !=
      (_Base_bitset<1UL>)
      ((long)&message.
              super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
              .
              super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
              .unparsed.
              super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed>
              .
              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_false>
              .
              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>::Unparsed,_void>
      + 0x10U)) {
    free((void *)message.
                 super_MessageRef<Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
                 .
                 super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
                 .allBits.super__Base_bitset<1UL>._M_w);
  }
  if (header.
      super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
      .
      super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
      .allBits.super__Base_bitset<1UL>._M_w !=
      (_Base_bitset<1UL>)
      ((long)&header.
              super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
              .
              super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
              .unparsed.
              super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
              .
              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_false>
              .
              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_void>
      + 0x10U)) {
    free((void *)header.
                 super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                 .
                 super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                 .allBits.super__Base_bitset<1UL>._M_w);
  }
  return;
}

Assistant:

void operator()(id<Header>, id<Message>)
            {
                Header header;
                Message message;

                enum class State {
                    InHeader,
                    InMessage
                };

                State state = State::InHeader;

                int checksum = 0;

                auto& cursor = context.cursor;

                while (!cursor.eof() && !hasError())
                {
                    int tag;

                    TRY_MATCH_INT(
                        tag,
                        "Encountered invalid tag, expected int, got '%c'",
                        CURSOR_CURRENT(cursor)
                    );
                    TRY_ADVANCE("Expected value after Tag %d, got EOF", tag);

                    if (state == State::InHeader)
                    {
                        FieldVisitor<Header> headerVisitor(context, Rules::StrictMode, Rules::SkipUnknownTags);
                        if (visitField(header, tag, headerVisitor))
                            continue;

                        FieldVisitor<Message> messageVisitor(context, Rules::StrictMode, Rules::SkipUnknownTags);
                        if (visitField(message, tag, messageVisitor))
                        {
                            state = State::InMessage;
                            continue;
                        }
                    }
                    else if (state == State::InMessage)
                    {
                        FieldVisitor<Message> messageVisitor(context, Rules::StrictMode, Rules::SkipUnknownTags);
                        if (visitField(message, tag, messageVisitor))
                            continue;
                    }

                    if (tag == 10)
                    {
                        TRY_MATCH_INT(
                            checksum,
                            "Invalid checksum, expected int, got '%c'",
                             CURSOR_CURRENT(cursor)
                        );
                        break;
                    }
                    else
                    {
                        StreamCursor::Token valueToken(cursor);
                        TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                        if (state == State::InHeader)
                            handleUnknownTag(valueToken, header, context, tag,
                                    BoolPack<Rules::SkipUnknownTags, Rules::StrictMode>{});
                        else
                            handleUnknownTag(valueToken, message, context, tag,
                                    BoolPack<Rules::SkipUnknownTags, Rules::StrictMode>{});

                    }

                    TRY_ADVANCE("Got early EOF");

                }

                if (!hasError())
                    callVisitor(header, message, std::is_void<typename Context::Type>{});
            }